

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O0

bool duckdb::PushdownInternal
               (ClientContext *context,MultiFileOptions *options,MultiFilePushdownInfo *info,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *filters,vector<duckdb::OpenFileInfo,_true> *expanded_files)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  value_type *__x;
  size_type sVar4;
  long in_RDX;
  byte *in_RSI;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *in_R8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  size_type start_files;
  idx_t i;
  HivePartitioningFilterInfo filter_info;
  MultiFilePushdownInfo *in_stack_00000190;
  HivePartitioningFilterInfo *in_stack_00000198;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_000001a0;
  vector<duckdb::OpenFileInfo,_true> *in_stack_000001a8;
  ClientContext *in_stack_000001b0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  in_stack_fffffffffffffef0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this;
  ulong local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_70;
  byte local_38;
  byte local_37;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *local_30;
  long local_20;
  byte *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HivePartitioningFilterInfo::HivePartitioningFilterInfo((HivePartitioningFilterInfo *)0x15551ac);
  for (local_78 = 0;
      sVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_20 + 0x10))
      , local_78 < sVar2; local_78 = local_78 + 1) {
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_fffffffffffffef0._M_cur,
                        CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    bVar1 = IsVirtualColumn(*pvVar3);
    if (!bVar1) {
      this = &local_70;
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffef0._M_cur,
                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      __x = (value_type *)
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_stack_fffffffffffffef0._M_cur,
                         CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<unsigned_long_&,_true>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                 (unsigned_long *)in_stack_fffffffffffffef0._M_cur);
      pVar5 = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)this,__x);
      in_stack_fffffffffffffef0._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur;
      in_stack_fffffffffffffeef = pVar5.second;
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x15552e0);
    }
  }
  local_38 = local_18[1] & 1;
  local_37 = *local_18 & 1;
  sVar2 = std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::size(local_30);
  HivePartitioning::ApplyFiltersToFileList
            (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
             in_stack_00000190);
  sVar4 = std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::size(local_30);
  local_1 = sVar4 != sVar2;
  HivePartitioningFilterInfo::~HivePartitioningFilterInfo((HivePartitioningFilterInfo *)0x15553c7);
  return (bool)(local_1 & 1);
}

Assistant:

bool PushdownInternal(ClientContext &context, const MultiFileOptions &options, MultiFilePushdownInfo &info,
                      vector<unique_ptr<Expression>> &filters, vector<OpenFileInfo> &expanded_files) {
	HivePartitioningFilterInfo filter_info;
	for (idx_t i = 0; i < info.column_ids.size(); i++) {
		if (IsVirtualColumn(info.column_ids[i])) {
			continue;
		}
		filter_info.column_map.insert({info.column_names[info.column_ids[i]], i});
	}
	filter_info.hive_enabled = options.hive_partitioning;
	filter_info.filename_enabled = options.filename;

	auto start_files = expanded_files.size();
	HivePartitioning::ApplyFiltersToFileList(context, expanded_files, filters, filter_info, info);

	if (expanded_files.size() != start_files) {
		return true;
	}

	return false;
}